

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

void __thiscall GraphTestDependencyCycle::Run(GraphTestDependencyCycle *this)

{
  Test *pTVar1;
  bool bVar2;
  Node *node;
  string err;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "build out: cat mid\nbuild mid: cat in\nbuild in: cat pre\nbuild pre: cat out\n",
              (ManifestParserOptions)0x0);
  pTVar1 = g_current_test;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"out",&local_59);
  node = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_38);
  bVar2 = DependencyScan::RecomputeDirty(&(this->super_GraphTest).scan_,node,&local_58);
  testing::Test::Check
            (pTVar1,!bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
             ,0x15c,"scan_.RecomputeDirty(GetNode(\"out\"), &err)");
  std::__cxx11::string::~string((string *)&local_38);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("dependency cycle: out -> mid -> in -> pre -> out",&local_58);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                     ,0x15d,"\"dependency cycle: out -> mid -> in -> pre -> out\" == err");
  if (!bVar2) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

TEST_F(GraphTest, DependencyCycle) {
  AssertParse(&state_,
"build out: cat mid\n"
"build mid: cat in\n"
"build in: cat pre\n"
"build pre: cat out\n");

  string err;
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("out"), &err));
  ASSERT_EQ("dependency cycle: out -> mid -> in -> pre -> out", err);
}